

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O2

bool mg::data::mzp_read(string *data,Mzp *out)

{
  pointer pMVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  MzpArchiveEntry *entry_1;
  pointer pMVar5;
  uint16_t i;
  ulong uVar6;
  uint local_3c;
  MzpArchiveEntry local_38;
  MzpArchiveEntry entry;
  
  if (data->_M_string_length < 8) {
    return false;
  }
  out->header = *(MzpArchiveHeader *)(data->_M_dataplus)._M_p;
  iVar3 = bcmp(out,"mrgd00",6);
  if (iVar3 == 0) {
    pMVar5 = (out->entry_headers).
             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((out->entry_headers).
        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
      (out->entry_headers).
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar5;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&out->entry_data);
    for (uVar6 = 0; uVar6 < (out->header).archive_entry_count; uVar6 = uVar6 + 1) {
      local_38 = *(MzpArchiveEntry *)((data->_M_dataplus)._M_p + uVar6 * 8 + 8);
      std::vector<mg::data::Mzp::MzpArchiveEntry,std::allocator<mg::data::Mzp::MzpArchiveEntry>>::
      emplace_back<mg::data::Mzp::MzpArchiveEntry&>
                ((vector<mg::data::Mzp::MzpArchiveEntry,std::allocator<mg::data::Mzp::MzpArchiveEntry>>
                  *)&out->entry_headers,&local_38);
    }
    pMVar1 = (out->entry_headers).
             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar5 = (out->entry_headers).
                  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar1; pMVar5 = pMVar5 + 1)
    {
      uVar4 = Mzp::archive_entry_start_offset(out,pMVar5);
      local_38 = (MzpArchiveEntry)((ulong)uVar4 + (long)(data->_M_dataplus)._M_p);
      local_3c = (uint)pMVar5->size_bytes | (pMVar5->size_sectors & 0xffe0) << 0xb;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,unsigned_int>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &out->entry_data,(char **)&local_38,&local_3c);
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool mzp_read(const std::string &data, Mzp &out) {
  // Is file large enough to have a header
  if (data.size() < sizeof(Mzp::MzpArchiveHeader)) {
    return false;
  }

  // Read off header
  out.header = *reinterpret_cast<const Mzp::MzpArchiveHeader *>(&data[0]);
  out.header.to_host_order();

  // Valid magic?
  if (memcmp(out.header.magic, Mzp::FILE_MAGIC,
             sizeof(Mzp::MzpArchiveHeader::magic)) != 0) {
    return false;
  }

  // Clear output vecs
  out.entry_headers.clear();
  out.entry_data.clear();

  // Iterate the archive entries
  for (uint16_t i = 0; i < out.header.archive_entry_count; i++) {
    // Calculate start offset of header record
    std::string::size_type archive_header_offset =
        sizeof(Mzp::MzpArchiveHeader) + sizeof(Mzp::MzpArchiveEntry) * i;

    // Clone data
    Mzp::MzpArchiveEntry entry =
        *reinterpret_cast<const Mzp::MzpArchiveEntry *>(
            &data[archive_header_offset]);
    entry.to_host_order();

    // Add to header
    out.entry_headers.emplace_back(entry);
  }

  // Scan through and extract the actual archive data
  for (auto &entry : out.entry_headers) {
    out.entry_data.emplace_back(&data[out.archive_entry_start_offset(entry)],
                                entry.entry_data_size());
  }

  return true;
}